

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O0

void __thiscall
spirv_cross::Compiler::register_global_read_dependencies
          (Compiler *this,SPIRBlock *block,uint32_t id)

{
  SmallVector<bool,_8UL> *pSVar1;
  uint32_t id_00;
  SPIRFunction *func_00;
  TypedID<(spirv_cross::Types)0> local_64;
  SPIRType *local_60;
  SPIRType *type;
  SPIRVariable *var;
  uint32_t func;
  Op op;
  uint32_t *ops;
  Instruction *i;
  Instruction *__end1;
  Instruction *__begin1;
  SmallVector<spirv_cross::Instruction,_8UL> *__range1;
  SPIRBlock *pSStack_18;
  uint32_t id_local;
  SPIRBlock *block_local;
  Compiler *this_local;
  
  __begin1 = (Instruction *)&block->ops;
  __range1._4_4_ = id;
  pSStack_18 = block;
  block_local = (SPIRBlock *)this;
  __end1 = VectorView<spirv_cross::Instruction>::begin
                     ((VectorView<spirv_cross::Instruction> *)__begin1);
  i = VectorView<spirv_cross::Instruction>::end((VectorView<spirv_cross::Instruction> *)__begin1);
  for (; __end1 != i; __end1 = __end1 + 1) {
    ops = (uint32_t *)__end1;
    _func = stream(this,__end1);
    var._4_4_ = (uint)(ushort)*ops;
    if (var._4_4_ == 0x39) {
      var._0_4_ = _func[2];
      func_00 = get<spirv_cross::SPIRFunction>(this,(uint32_t)var);
      register_global_read_dependencies(this,func_00,__range1._4_4_);
    }
    else if ((((var._4_4_ == 0x3d) || (var._4_4_ == 0x62)) &&
             (type = (SPIRType *)maybe_get_backing_variable(this,_func[2]), type != (SPIRType *)0x0)
             ) && (type->basetype != Int)) {
      id_00 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(type->super_IVariant).field_0xc);
      local_60 = get<spirv_cross::SPIRType>(this,id_00);
      if ((local_60->basetype != Image) && ((local_60->image).dim != DimSubpassData)) {
        pSVar1 = &type->array_size_literal;
        TypedID<(spirv_cross::Types)0>::TypedID(&local_64,__range1._4_4_);
        SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,_8UL>::push_back
                  ((SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,_8UL> *)
                   &(pSVar1->super_VectorView<bool>).buffer_size,&local_64);
      }
    }
  }
  return;
}

Assistant:

void Compiler::register_global_read_dependencies(const SPIRBlock &block, uint32_t id)
{
	for (auto &i : block.ops)
	{
		auto ops = stream(i);
		auto op = static_cast<Op>(i.op);

		switch (op)
		{
		case OpFunctionCall:
		{
			uint32_t func = ops[2];
			register_global_read_dependencies(get<SPIRFunction>(func), id);
			break;
		}

		case OpLoad:
		case OpImageRead:
		{
			// If we're in a storage class which does not get invalidated, adding dependencies here is no big deal.
			auto *var = maybe_get_backing_variable(ops[2]);
			if (var && var->storage != StorageClassFunction)
			{
				auto &type = get<SPIRType>(var->basetype);

				// InputTargets are immutable.
				if (type.basetype != SPIRType::Image && type.image.dim != DimSubpassData)
					var->dependees.push_back(id);
			}
			break;
		}

		default:
			break;
		}
	}
}